

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool picojson::
     _parse_object<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
               (default_parse_context *ctx,
               input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_50 [8];
  string key;
  
  bVar1 = default_parse_context::parse_object_start(ctx);
  if (bVar1) {
    bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x7d);
    bVar2 = true;
    if (!bVar1) {
      do {
        key._M_dataplus._M_p = (pointer)0x0;
        key._M_string_length._0_1_ = 0;
        local_50 = (undefined1  [8])&key._M_string_length;
        bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x22);
        if (bVar1) {
          bVar1 = _parse_string<std::__cxx11::string,std::istreambuf_iterator<char,std::char_traits<char>>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_50,in);
          if (!bVar1) goto LAB_001174a8;
          bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x3a);
          if (!bVar1) goto LAB_001174a8;
          bVar1 = default_parse_context::
                  parse_object_item<std::istreambuf_iterator<char,std::char_traits<char>>>
                            (ctx,in,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50);
        }
        else {
LAB_001174a8:
          bVar1 = false;
        }
        if (local_50 != (undefined1  [8])&key._M_string_length) {
          operator_delete((void *)local_50);
        }
        if (bVar1 == false) goto LAB_001174de;
        bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x2c);
      } while (bVar1);
      bVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x7d);
    }
  }
  else {
LAB_001174de:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool _parse_object(Context& ctx, input<Iter>& in) {
    if (! ctx.parse_object_start()) {
      return false;
    }
    if (in.expect('}')) {
      return true;
    }
    do {
      std::string key;
      if (! in.expect('"')
      || ! _parse_string(key, in)
      || ! in.expect(':')) {
    return false;
      }
      if (! ctx.parse_object_item(in, key)) {
    return false;
      }
    } while (in.expect(','));
    return in.expect('}');
  }